

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_script.cpp
# Opt level: O3

void __thiscall DRunningScript::Serialize(DRunningScript *this,FSerializer *arc)

{
  FSerializer *pFVar1;
  
  DObject::Serialize(&this->super_DObject,arc);
  ::Serialize(arc,"script",(DObject **)&this->script,(DObject **)0x0,(bool *)0x0);
  pFVar1 = ::Serialize(arc,"save_point",&this->save_point,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"wait_type",&this->wait_type,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"wait_data",&this->wait_data,(int32_t *)0x0);
  ::Serialize(pFVar1,"prev",(DObject **)&this->prev,(DObject **)0x0,(bool *)0x0);
  ::Serialize(pFVar1,"next",(DObject **)&this->next,(DObject **)0x0,(bool *)0x0);
  ::Serialize(pFVar1,"trigger",(DObject **)&this->trigger,(DObject **)0x0,(bool *)0x0);
  FSerializer::Array<TObjPtr<DFsVariable>>(pFVar1,"variables",this->variables,0x10,false);
  return;
}

Assistant:

void DRunningScript::Serialize(FSerializer &arc)
{
	Super::Serialize(arc);
	arc("script", script)
		("save_point", save_point)
		("wait_type", wait_type)
		("wait_data", wait_data)
		("prev", prev)
		("next", next)
		("trigger", trigger)
		.Array("variables", variables, VARIABLESLOTS);
}